

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

void duckdb::StringStats::Serialize(BaseStatistics *stats,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,200,"min");
  (*serializer->_vptr_Serializer[0x1e])(serializer,&stats->stats_union,8);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"max");
  (*serializer->_vptr_Serializer[0x1e])(serializer,(undefined1 *)((long)&stats->stats_union + 8),8);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"has_unicode");
  (*serializer->_vptr_Serializer[0xe])
            (serializer,(ulong)(stats->stats_union).string_data.has_unicode);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcb,"has_max_string_length");
  (*serializer->_vptr_Serializer[0xe])
            (serializer,(ulong)(stats->stats_union).string_data.has_max_string_length);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcc,"max_string_length");
  (*serializer->_vptr_Serializer[0x13])
            (serializer,(ulong)(stats->stats_union).string_data.max_string_length);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void StringStats::Serialize(const BaseStatistics &stats, Serializer &serializer) {
	auto &string_data = StringStats::GetDataUnsafe(stats);
	serializer.WriteProperty(200, "min", string_data.min, StringStatsData::MAX_STRING_MINMAX_SIZE);
	serializer.WriteProperty(201, "max", string_data.max, StringStatsData::MAX_STRING_MINMAX_SIZE);
	serializer.WriteProperty(202, "has_unicode", string_data.has_unicode);
	serializer.WriteProperty(203, "has_max_string_length", string_data.has_max_string_length);
	serializer.WriteProperty(204, "max_string_length", string_data.max_string_length);
}